

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int check_token_segment(Context_conflict *ctx,char *str)

{
  uint uVar1;
  char *__s1;
  int iVar2;
  size_t __n;
  int iVar3;
  
  __n = strlen(str);
  uVar1 = ctx->tokenlen;
  iVar3 = 0;
  if (__n <= uVar1) {
    __s1 = ctx->token;
    iVar2 = strncasecmp(__s1,str,__n);
    iVar3 = 0;
    if (iVar2 == 0) {
      ctx->token = __s1 + __n;
      ctx->tokenlen = uVar1 - (int)__n;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int check_token_segment(Context *ctx, const char *str)
{
    // !!! FIXME: these are case-insensitive, right?
    const size_t len = strlen(str);
    if ( (ctx->tokenlen < len) || (strncasecmp(ctx->token, str, len) != 0) )
        return 0;
    ctx->token += len;
    ctx->tokenlen -= len;
    return 1;
}